

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O1

int __thiscall deqp::gls::RandomShaderCase::init(RandomShaderCase *this,EVP_PKEY_CTX *ctx)

{
  Shader *vertexShader;
  Shader *fragmentShader;
  char *pcVar1;
  int iVar2;
  ShaderInput *pSVar3;
  Variable *pVVar4;
  pointer pSVar5;
  pointer puVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined8 uVar12;
  bool bVar13;
  unsigned_short uVar14;
  int extraout_EAX;
  long lVar15;
  TextureCube *pTVar16;
  mapped_type *ppTVar17;
  TestError *this_00;
  int iVar18;
  pointer ppSVar19;
  uint uVar20;
  pointer pVVar21;
  int iVar22;
  unsigned_short uVar23;
  ulong uVar24;
  ulong uVar25;
  float fVar26;
  float fVar27;
  ProgramGenerator programGenerator;
  vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> unifiedUniforms;
  VertexArray vtxArray;
  Random rnd;
  ProgramGenerator local_122;
  allocator<char> local_121;
  RandomShaderCase *local_120;
  uint local_118;
  float local_114;
  map<int,_const_glu::TextureCube_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_glu::TextureCube_*>_>_>
  *local_110;
  ulong local_108;
  TextureManager *local_100;
  int local_f4;
  float local_f0;
  float local_ec;
  vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> local_e8;
  undefined1 local_d0 [16];
  pointer local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  int local_a8;
  VariableType *local_a0;
  pointer pMStack_98;
  pointer local_90;
  pointer pMStack_88;
  vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_> *local_80;
  pointer local_78;
  ulong local_70;
  pointer local_68;
  long *local_60 [2];
  long local_50 [2];
  deRandom local_40;
  
  rsg::ProgramGenerator::ProgramGenerator(&local_122);
  vertexShader = &this->m_vertexShader;
  fragmentShader = &this->m_fragmentShader;
  rsg::ProgramGenerator::generate(&local_122,&this->m_parameters,vertexShader,fragmentShader);
  checkShaderLimits(this,vertexShader);
  checkShaderLimits(this,fragmentShader);
  checkProgramLimits(this,vertexShader,fragmentShader);
  local_e8.super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&local_40,(this->m_parameters).seed);
  rsg::computeUnifiedUniforms(vertexShader,fragmentShader,&local_e8);
  rsg::computeUniformValues((Random *)&local_40,&this->m_uniforms,&local_e8);
  ppSVar19 = (this->m_vertexShader).m_inputs.
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_120 = this;
  if (ppSVar19 !=
      (this->m_vertexShader).m_inputs.
      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_118 = (this->m_gridHeight + 1) * (this->m_gridWidth + 1);
    local_80 = &this->m_vertexArrays;
    local_70 = (ulong)local_118;
    do {
      pSVar3 = *ppSVar19;
      pVVar4 = pSVar3->m_variable;
      local_68 = (pSVar3->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pSVar5 = (pSVar3->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
               .super__Vector_impl_data._M_start;
      uVar20 = (pVVar4->m_type).m_numElements;
      local_d0._0_8_ = pSVar3;
      local_78 = ppSVar19;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)(local_d0 + 8),
                 (long)(int)((pSVar3->m_variable->m_type).m_numElements * local_118),
                 (allocator_type *)local_60);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_60,(pSVar3->m_variable->m_name)._M_dataplus._M_p,&local_121);
      local_f4 = std::__cxx11::string::compare((char *)local_60);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      if ((pSVar3->m_variable->m_type).m_baseType != TYPE_FLOAT) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,
                   "input->getVariable()->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                   ,0xa5);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (0 < (int)local_118) {
        local_108 = 0;
        uVar24 = 0;
        do {
          uVar12 = local_d0._8_8_;
          iVar2 = local_120->m_gridWidth + 1;
          iVar22 = (int)uVar24;
          iVar18 = (int)((long)((ulong)(uint)(iVar22 >> 0x1f) << 0x20 | uVar24 & 0xffffffff) /
                        (long)iVar2);
          fVar26 = (float)(iVar22 - iVar2 * iVar18) / (float)local_120->m_gridWidth;
          fVar27 = (float)iVar18 / (float)local_120->m_gridHeight;
          if (local_f4 == 0) {
            lVar15 = (long)(int)(uVar20 * iVar22);
            *(float *)(local_d0._8_8_ + lVar15 * 4) = fVar26 + fVar26 + -1.0;
            *(float *)(local_d0._8_8_ + lVar15 * 4 + 4) = 1.0 - (fVar27 + fVar27);
            pcVar1 = (char *)(local_d0._8_8_ + lVar15 * 4 + 8);
            pcVar1[0] = '\0';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            pcVar1[4] = '\0';
            pcVar1[5] = '\0';
            pcVar1[6] = -0x80;
            pcVar1[7] = '?';
          }
          else {
            local_110 = (map<int,_const_glu::TextureCube_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_glu::TextureCube_*>_>_>
                         *)CONCAT44(local_110._4_4_,fVar26);
            local_114 = fVar27;
            if (0 < (int)uVar20) {
              lVar15 = (long)(int)local_108;
              local_ec = 1.0 - fVar26;
              local_f0 = 1.0 - fVar27;
              uVar25 = 0;
              do {
                rsg::VariableType::getElementType(&pVVar4->m_type);
                local_100 = (TextureManager *)CONCAT44(local_100._4_4_,local_68[uVar25].intVal);
                rsg::VariableType::getElementType(&pVVar4->m_type);
                fVar26 = local_110._0_4_;
                if ((uVar25 & 2) != 0) {
                  fVar26 = local_ec;
                }
                fVar27 = local_114;
                if ((uVar25 & 1) != 0) {
                  fVar27 = local_f0;
                }
                *(float *)(uVar12 + uVar25 * 4 + lVar15 * 4) =
                     (pSVar5[uVar25].floatVal - local_100._0_4_) * (fVar26 + fVar27) * 0.5 +
                     local_100._0_4_;
                uVar25 = uVar25 + 1;
              } while (uVar20 != uVar25);
            }
          }
          uVar24 = uVar24 + 1;
          local_108 = (ulong)((int)local_108 + uVar20);
        } while (uVar24 != local_70);
      }
      std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>::push_back
                (local_80,(value_type *)local_d0);
      this = local_120;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_d0._8_8_,
                        CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) -
                        local_d0._8_8_);
      }
      ppSVar19 = local_78 + 1;
    } while (ppSVar19 !=
             (this->m_vertexShader).m_inputs.
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  uVar20 = this->m_gridHeight * this->m_gridWidth;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->m_indices,(long)(int)(uVar20 * 6));
  if (0 < (int)uVar20) {
    iVar2 = this->m_gridWidth;
    puVar6 = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar11 = (short)iVar2;
    iVar18 = 0;
    lVar15 = 0;
    do {
      sVar7 = (short)iVar18;
      sVar8 = (short)(iVar18 / iVar2);
      iVar22 = (int)lVar15;
      puVar6[iVar22] = sVar7 + sVar8;
      sVar9 = (sVar8 + 1) * (sVar11 + 1);
      sVar10 = -sVar11 * sVar8;
      uVar23 = sVar7 + sVar10 + sVar9;
      puVar6[iVar22 + 1] = uVar23;
      uVar14 = sVar7 + 1 + sVar8;
      puVar6[iVar22 + 2] = uVar14;
      puVar6[iVar22 + 3] = uVar14;
      puVar6[iVar22 + 4] = uVar23;
      puVar6[iVar22 + 5] = sVar7 + sVar10 + sVar9 + 1;
      lVar15 = lVar15 + 6;
      iVar18 = iVar18 + 1;
    } while ((ulong)uVar20 * 6 != lVar15);
  }
  pVVar21 = (this->m_uniforms).
            super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pVVar21 !=
      (this->m_uniforms).super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_110 = &(this->m_texManager).m_texCube;
    local_100 = &this->m_texManager;
    do {
      pVVar4 = pVVar21->m_variable;
      if (((pVVar4->m_type).m_baseType & ~TYPE_FLOAT) == TYPE_SAMPLER_2D) {
        iVar2 = ((pVVar21->m_storage).m_value.
                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                 super__Vector_impl_data._M_start)->intVal;
        local_d0._0_8_ = (ShaderInput *)0x6;
        local_c0 = (pointer)0x0;
        local_b8._M_local_buf[0] = '\0';
        local_a8 = 1;
        local_90 = (pointer)0x0;
        pMStack_88 = (pointer)0x0;
        local_a0 = (VariableType *)0x0;
        pMStack_98 = (pointer)0x0;
        local_d0._8_8_ = &local_b8;
        bVar13 = rsg::VariableType::operator==(&pVVar4->m_type,(VariableType *)local_d0);
        rsg::VariableType::~VariableType((VariableType *)local_d0);
        if (bVar13) {
          pTVar16 = (TextureCube *)getTex2D(local_120);
          local_d0._0_4_ = iVar2;
          ppTVar17 = (mapped_type *)
                     std::
                     map<int,_const_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_glu::Texture2D_*>_>_>
                     ::operator[](&local_100->m_tex2D,(key_type *)local_d0);
        }
        else {
          local_d0._0_8_ = (ShaderInput *)0x7;
          local_c0 = (pointer)0x0;
          local_b8._M_local_buf[0] = '\0';
          local_a8 = 1;
          local_90 = (pointer)0x0;
          pMStack_88 = (pointer)0x0;
          local_a0 = (VariableType *)0x0;
          pMStack_98 = (pointer)0x0;
          local_d0._8_8_ = &local_b8;
          bVar13 = rsg::VariableType::operator==(&pVVar4->m_type,(VariableType *)local_d0);
          rsg::VariableType::~VariableType((VariableType *)local_d0);
          if (!bVar13) goto LAB_0048da48;
          pTVar16 = getTexCube(local_120);
          local_d0._0_4_ = iVar2;
          ppTVar17 = std::
                     map<int,_const_glu::TextureCube_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_glu::TextureCube_*>_>_>
                     ::operator[](local_110,(key_type *)local_d0);
        }
        *ppTVar17 = pTVar16;
      }
LAB_0048da48:
      pVVar21 = pVVar21 + 1;
    } while (pVVar21 !=
             (local_120->m_uniforms).
             super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_e8.
      super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  rsg::ProgramGenerator::~ProgramGenerator(&local_122);
  return extraout_EAX;
}

Assistant:

void RandomShaderCase::init (void)
{
	// Generate shaders
	rsg::ProgramGenerator programGenerator;
	programGenerator.generate(m_parameters, m_vertexShader, m_fragmentShader);

	checkShaderLimits(m_vertexShader);
	checkShaderLimits(m_fragmentShader);
	checkProgramLimits(m_vertexShader, m_fragmentShader);

	// Compute uniform values
	std::vector<const rsg::ShaderInput*>	unifiedUniforms;
	de::Random								rnd(m_parameters.seed);
	rsg::computeUnifiedUniforms(m_vertexShader, m_fragmentShader, unifiedUniforms);
	rsg::computeUniformValues(rnd, m_uniforms, unifiedUniforms);

	// Generate vertices
	const vector<rsg::ShaderInput*>&	inputs		= m_vertexShader.getInputs();
	int									numVertices	= (m_gridWidth+1)*(m_gridHeight+1);

	for (vector<rsg::ShaderInput*>::const_iterator i = inputs.begin(); i != inputs.end(); i++)
	{
		const rsg::ShaderInput*			input			= *i;
		rsg::ConstValueRangeAccess		valueRange		= input->getValueRange();
		int								numComponents	= input->getVariable()->getType().getNumElements();
		VertexArray						vtxArray(input, numVertices);
		bool							isPosition		= string(input->getVariable()->getName()) == "dEQP_Position";

		TCU_CHECK(input->getVariable()->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT);

		for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx++)
		{
			int		y	= vtxNdx / (m_gridWidth+1);
			int		x	= vtxNdx - y*(m_gridWidth+1);
			float	xf	= (float)x / (float)m_gridWidth;
			float	yf	= (float)y / (float)m_gridHeight;
			float*	dst	= &vtxArray.getVertices()[vtxNdx*numComponents];

			if (isPosition)
			{
				// Position attribute gets special interpolation handling.
				DE_ASSERT(numComponents == 4);
				dst[0] = -1.0f + xf *  2.0f;
				dst[1] =  1.0f + yf * -2.0f;
				dst[2] = 0.0f;
				dst[3] = 1.0f;
			}
			else
			{
				for (int compNdx = 0; compNdx < numComponents; compNdx++)
				{
					float	minVal	= valueRange.getMin().component(compNdx).asFloat();
					float	maxVal	= valueRange.getMax().component(compNdx).asFloat();
					float	xd, yd;

					rsg::getVertexInterpolationCoords(xd, yd, xf, yf, compNdx);

					float	f		= (xd+yd) / 2.0f;

					dst[compNdx] = minVal + f * (maxVal-minVal);
				}
			}
		}

		m_vertexArrays.push_back(vtxArray);
	}

	// Generate indices
	int numQuads	= m_gridWidth*m_gridHeight;
	int numIndices	= numQuads*6;
	m_indices.resize(numIndices);
	for (int quadNdx = 0; quadNdx < numQuads; quadNdx++)
	{
		int	quadY	= quadNdx / (m_gridWidth);
		int quadX	= quadNdx - quadY*m_gridWidth;

		m_indices[quadNdx*6+0] = (deUint16)(quadX + quadY*(m_gridWidth+1));
		m_indices[quadNdx*6+1] = (deUint16)(quadX + (quadY+1)*(m_gridWidth+1));
		m_indices[quadNdx*6+2] = (deUint16)(quadX + quadY*(m_gridWidth+1) + 1);
		m_indices[quadNdx*6+3] = (deUint16)(m_indices[quadNdx*6+2]);
		m_indices[quadNdx*6+4] = (deUint16)(m_indices[quadNdx*6+1]);
		m_indices[quadNdx*6+5] = (deUint16)(quadX + (quadY+1)*(m_gridWidth+1) + 1);
	}

	// Create textures.
	for (vector<rsg::VariableValue>::const_iterator uniformIter = m_uniforms.begin(); uniformIter != m_uniforms.end(); uniformIter++)
	{
		const rsg::VariableType& type = uniformIter->getVariable()->getType();

		if (!type.isSampler())
			continue;

		int unitNdx = uniformIter->getValue().asInt(0);

		if (type == rsg::VariableType(rsg::VariableType::TYPE_SAMPLER_2D, 1))
			m_texManager.bindTexture(unitNdx, getTex2D());
		else if (type == rsg::VariableType(rsg::VariableType::TYPE_SAMPLER_CUBE, 1))
			m_texManager.bindTexture(unitNdx, getTexCube());
		else
			DE_ASSERT(DE_FALSE);
	}
}